

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
          (QPodArrayOps<QToolBarAreaLayoutItem> *this,qsizetype i,QToolBarAreaLayoutItem *args)

{
  QToolBarAreaLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QLayoutItem *pQVar5;
  QToolBarAreaLayoutItem *pQVar6;
  bool bVar7;
  undefined3 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  qsizetype qVar12;
  QToolBarAreaLayoutItem *pQVar13;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size == i) &&
       (qVar12 = QArrayDataPointer<QToolBarAreaLayoutItem>::freeSpaceAtEnd
                           (&this->super_QArrayDataPointer<QToolBarAreaLayoutItem>), qVar12 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size;
      pQVar13 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      bVar7 = args->gap;
      uVar8 = *(undefined3 *)&args->field_0x15;
      pQVar6 = pQVar13 + lVar4;
      pQVar6->preferredSize = args->preferredSize;
      pQVar6->gap = bVar7;
      *(undefined3 *)&pQVar6->field_0x15 = uVar8;
      iVar9 = args->pos;
      iVar10 = args->size;
      pQVar13 = pQVar13 + lVar4;
      pQVar13->widgetItem = args->widgetItem;
      pQVar13->pos = iVar9;
      pQVar13->size = iVar10;
    }
    else {
      if ((i != 0) ||
         (qVar12 = QArrayDataPointer<QToolBarAreaLayoutItem>::freeSpaceAtBegin
                             (&this->super_QArrayDataPointer<QToolBarAreaLayoutItem>), qVar12 == 0))
      goto LAB_00472695;
      pQVar13 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      bVar7 = args->gap;
      uVar8 = *(undefined3 *)&args->field_0x15;
      pQVar13[-1].preferredSize = args->preferredSize;
      pQVar13[-1].gap = bVar7;
      *(undefined3 *)&pQVar13[-1].field_0x15 = uVar8;
      iVar9 = args->pos;
      iVar10 = args->size;
      pQVar13[-1].widgetItem = args->widgetItem;
      pQVar13[-1].pos = iVar9;
      pQVar13[-1].size = iVar10;
      ppQVar1 = &(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_00472695:
  pQVar5 = args->widgetItem;
  iVar9 = args->pos;
  iVar10 = args->size;
  iVar11 = args->preferredSize;
  bVar7 = args->gap;
  uVar8 = *(undefined3 *)&args->field_0x15;
  where = (GrowthPosition)
          (i == 0 && (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size != 0);
  QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QToolBarAreaLayoutItem>,where,1,
             (QToolBarAreaLayoutItem **)0x0,(QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0);
  pQVar13 = createHole(this,where,i,1);
  pQVar13->widgetItem = pQVar5;
  pQVar13->pos = iVar9;
  pQVar13->size = iVar10;
  pQVar13->preferredSize = iVar11;
  pQVar13->gap = bVar7;
  *(undefined3 *)&pQVar13->field_0x15 = uVar8;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }